

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O1

void Pdr_ManStop(Pdr_Man_t *p)

{
  void *pvVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  void **ppvVar4;
  Vec_Wec_t *__ptr;
  uint *__ptr_00;
  bool bVar5;
  Vec_Vec_t *pVVar6;
  uint level;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  Gia_ManStopP(&p->pGia);
  Aig_ManCleanMarkAB(p->pAig);
  if (p->pPars->fVerbose != 0) {
    level = p->nCexesTotal;
    Abc_Print(level,
              "Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Cex =%4d  Start =%4d\n",
              ((double)p->nCallsS * 100.0) / (double)p->nCalls,(ulong)(uint)p->nBlocks,
              (ulong)(uint)p->nObligs,(ulong)(uint)p->nCubes,(ulong)(uint)p->nCalls,(ulong)level,
              (ulong)(uint)p->nStarts);
    Abc_Print(level,"%s =","SAT solving");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tSat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tSat / 1000000.0,dVar10);
    Abc_Print(level,"%s =","  unsat    ");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tSatUnsat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tSatUnsat / 1000000.0,dVar10);
    Abc_Print(level,"%s =","  sat      ");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tSatSat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tSatSat / 1000000.0,dVar10);
    Abc_Print(level,"%s =","Generalize ");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tGeneral * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tGeneral / 1000000.0,dVar10);
    Abc_Print(level,"%s =","Push clause");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tPush * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tPush / 1000000.0,dVar10);
    Abc_Print(level,"%s =","Ternary sim");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tTsim * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tTsim / 1000000.0,dVar10);
    Abc_Print(level,"%s =","Containment");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tContain * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tContain / 1000000.0,dVar10);
    Abc_Print(level,"%s =","CNF compute");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tCnf * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tCnf / 1000000.0,dVar10);
    Abc_Print(level,"%s =","Refinement ");
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = ((double)p->tAbs * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tAbs / 1000000.0,dVar10);
    Abc_Print(level,"%s =","TOTAL      ");
    dVar10 = (double)p->tTotal;
    dVar11 = 0.0;
    if (p->tTotal != 0) {
      dVar11 = (dVar10 * 100.0) / dVar10;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10 / 1000000.0,dVar11);
    fflush(_stdout);
  }
  pVVar7 = p->vSolvers;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      sat_solver_delete((sat_solver *)pVVar7->pArray[lVar9]);
      lVar9 = lVar9 + 1;
      pVVar7 = p->vSolvers;
    } while (lVar9 < pVVar7->nSize);
  }
  if (pVVar7->pArray != (void **)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (void **)0x0;
  }
  if (pVVar7 != (Vec_Ptr_t *)0x0) {
    free(pVVar7);
  }
  pVVar6 = p->vClauses;
  if (pVVar6->nSize < 1) {
    bVar5 = false;
  }
  else {
    lVar9 = 0;
    do {
      pVVar6 = p->vClauses;
      if (pVVar6->nSize <= lVar9) {
LAB_005efece:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      lVar8 = 0;
      while (lVar8 < *(int *)((long)pVVar6->pArray[lVar9] + 4)) {
        Pdr_SetDeref(*(Pdr_Set_t **)(*(long *)((long)pVVar6->pArray[lVar9] + 8) + lVar8 * 8));
        lVar8 = lVar8 + 1;
        pVVar6 = p->vClauses;
        if (pVVar6->nSize <= lVar9) goto LAB_005efece;
      }
      lVar9 = lVar9 + 1;
      pVVar6 = p->vClauses;
    } while (lVar9 < pVVar6->nSize);
    bVar5 = 0 < pVVar6->nSize;
  }
  if (bVar5) {
    lVar9 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar9];
      if (pvVar1 != (void *)0x0) {
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        free(pvVar1);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar6->nSize);
  }
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Vec_t *)0x0) {
    free(pVVar6);
  }
  Pdr_QueueStop(p);
  if (p->pOrder != (int *)0x0) {
    free(p->pOrder);
    p->pOrder = (int *)0x0;
  }
  pVVar2 = p->vActVars;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  Cnf_DataFree(p->pCnf1);
  if (p->vVar2Reg != (Vec_Int_t *)0x0) {
    piVar3 = p->vVar2Reg->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vVar2Reg->pArray = (int *)0x0;
    }
    if (p->vVar2Reg != (Vec_Int_t *)0x0) {
      free(p->vVar2Reg);
      p->vVar2Reg = (Vec_Int_t *)0x0;
    }
  }
  Cnf_DataFree(p->pCnf2);
  if ((p->pvId2Vars != (Vec_Int_t *)0x0) && (0 < p->pAig->vObjs->nSize)) {
    lVar9 = 8;
    lVar8 = 0;
    do {
      pvVar1 = *(void **)((long)&p->pvId2Vars->nCap + lVar9);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)&p->pvId2Vars->nCap + lVar9) = 0;
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar8 < p->pAig->vObjs->nSize);
  }
  if (p->pvId2Vars != (Vec_Int_t *)0x0) {
    free(p->pvId2Vars);
    p->pvId2Vars = (Vec_Int_t *)0x0;
  }
  if (0 < (p->vVar2Ids).nSize) {
    lVar9 = 0;
    do {
      pvVar1 = (p->vVar2Ids).pArray[lVar9];
      if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar1 + 8));
        *(undefined8 *)((long)pvVar1 + 8) = 0;
      }
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vVar2Ids).nSize);
  }
  ppvVar4 = (p->vVar2Ids).pArray;
  if (ppvVar4 != (void **)0x0) {
    free(ppvVar4);
    (p->vVar2Ids).pArray = (void **)0x0;
  }
  __ptr = p->vVLits;
  if (__ptr != (Vec_Wec_t *)0x0) {
    if (0 < __ptr->nCap) {
      lVar8 = 8;
      lVar9 = 0;
      do {
        pvVar1 = *(void **)((long)&__ptr->pArray->nCap + lVar8);
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
          *(undefined8 *)((long)&__ptr->pArray->nCap + lVar8) = 0;
        }
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar9 < __ptr->nCap);
    }
    if (__ptr->pArray != (Vec_Int_t *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (Vec_Int_t *)0x0;
    }
    __ptr->nCap = 0;
    __ptr->nSize = 0;
    free(__ptr);
    p->vVLits = (Vec_Wec_t *)0x0;
  }
  Cnf_ManStop(p->pCnfMan);
  if (p->vAbsFlops != (Vec_Int_t *)0x0) {
    piVar3 = p->vAbsFlops->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vAbsFlops->pArray = (int *)0x0;
    }
    if (p->vAbsFlops != (Vec_Int_t *)0x0) {
      free(p->vAbsFlops);
      p->vAbsFlops = (Vec_Int_t *)0x0;
    }
  }
  if (p->vMapFf2Ppi != (Vec_Int_t *)0x0) {
    piVar3 = p->vMapFf2Ppi->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vMapFf2Ppi->pArray = (int *)0x0;
    }
    if (p->vMapFf2Ppi != (Vec_Int_t *)0x0) {
      free(p->vMapFf2Ppi);
      p->vMapFf2Ppi = (Vec_Int_t *)0x0;
    }
  }
  if (p->vMapPpi2Ff != (Vec_Int_t *)0x0) {
    piVar3 = p->vMapPpi2Ff->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vMapPpi2Ff->pArray = (int *)0x0;
    }
    if (p->vMapPpi2Ff != (Vec_Int_t *)0x0) {
      free(p->vMapPpi2Ff);
      p->vMapPpi2Ff = (Vec_Int_t *)0x0;
    }
  }
  if (p->pPars->fNewXSim != 0) {
    Txs3_ManStop(p->pTxs3);
  }
  if (p->vPrio != (Vec_Int_t *)0x0) {
    piVar3 = p->vPrio->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      p->vPrio->pArray = (int *)0x0;
    }
    if (p->vPrio != (Vec_Int_t *)0x0) {
      free(p->vPrio);
      p->vPrio = (Vec_Int_t *)0x0;
    }
  }
  pVVar2 = p->vLits;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCiObjs;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCoObjs;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCiVals;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCoVals;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vNodes;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vUndo;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vVisits;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vCi2Rem;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vRes;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  if (p->vInfCubes != (Vec_Ptr_t *)0x0) {
    ppvVar4 = p->vInfCubes->pArray;
    if (ppvVar4 != (void **)0x0) {
      free(ppvVar4);
      p->vInfCubes->pArray = (void **)0x0;
    }
    if (p->vInfCubes != (Vec_Ptr_t *)0x0) {
      free(p->vInfCubes);
      p->vInfCubes = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  pVVar7 = p->vCexes;
  if (pVVar7 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar7->nSize) {
      lVar9 = 0;
      do {
        if ((void *)0x2 < pVVar7->pArray[lVar9]) {
          free(pVVar7->pArray[lVar9]);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < pVVar7->nSize);
    }
    if (pVVar7->pArray != (void **)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (void **)0x0;
    }
    free(pVVar7);
  }
  if (p->pAig->pFanData != (int *)0x0) {
    Aig_ManFanoutStop(p->pAig);
  }
  __ptr_00 = p->pAig->pTerSimData;
  if (__ptr_00 != (uint *)0x0) {
    free(__ptr_00);
    p->pAig->pTerSimData = (uint *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Pdr_ManStop( Pdr_Man_t * p )
{
    Pdr_Set_t * pCla;
    sat_solver * pSat;
    int i, k;
    Gia_ManStopP( &p->pGia );
    Aig_ManCleanMarkAB( p->pAig );
    if ( p->pPars->fVerbose ) 
    {
        Abc_Print( 1, "Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Cex =%4d  Start =%4d\n", 
            p->nBlocks, p->nObligs, p->nCubes, p->nCalls, 100.0 * p->nCallsS / p->nCalls, p->nCexesTotal, p->nStarts );
        ABC_PRTP( "SAT solving", p->tSat,       p->tTotal );
        ABC_PRTP( "  unsat    ", p->tSatUnsat,  p->tTotal );
        ABC_PRTP( "  sat      ", p->tSatSat,    p->tTotal );
        ABC_PRTP( "Generalize ", p->tGeneral,   p->tTotal );
        ABC_PRTP( "Push clause", p->tPush,      p->tTotal );
        ABC_PRTP( "Ternary sim", p->tTsim,      p->tTotal );
        ABC_PRTP( "Containment", p->tContain,   p->tTotal );
        ABC_PRTP( "CNF compute", p->tCnf,       p->tTotal );
        ABC_PRTP( "Refinement ", p->tAbs,       p->tTotal );
        ABC_PRTP( "TOTAL      ", p->tTotal,     p->tTotal );
        fflush( stdout );
    }
//    Abc_Print( 1, "SS =%6d. SU =%6d. US =%6d. UU =%6d.\n", p->nCasesSS, p->nCasesSU, p->nCasesUS, p->nCasesUU );
    Vec_PtrForEachEntry( sat_solver *, p->vSolvers, pSat, i )
        sat_solver_delete( pSat );
    Vec_PtrFree( p->vSolvers );
    Vec_VecForEachEntry( Pdr_Set_t *, p->vClauses, pCla, i, k )
        Pdr_SetDeref( pCla );
    Vec_VecFree( p->vClauses );
    Pdr_QueueStop( p );
    ABC_FREE( p->pOrder );
    Vec_IntFree( p->vActVars );
    // static CNF
    Cnf_DataFree( p->pCnf1 );
    Vec_IntFreeP( &p->vVar2Reg );
    // dynamic CNF
    Cnf_DataFree( p->pCnf2 );
    if ( p->pvId2Vars )
    for ( i = 0; i < Aig_ManObjNumMax(p->pAig); i++ )
        ABC_FREE( p->pvId2Vars[i].pArray );
    ABC_FREE( p->pvId2Vars );
//    Vec_VecFreeP( (Vec_Vec_t **)&p->vVar2Ids );
    for ( i = 0; i < Vec_PtrSize(&p->vVar2Ids); i++ )
        Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids, i) );
    ABC_FREE( p->vVar2Ids.pArray );
    Vec_WecFreeP( &p->vVLits );
    // CNF manager
    Cnf_ManStop( p->pCnfMan );
    Vec_IntFreeP( &p->vAbsFlops );
    Vec_IntFreeP( &p->vMapFf2Ppi );
    Vec_IntFreeP( &p->vMapPpi2Ff );
    // terminary simulation
    if ( p->pPars->fNewXSim )
        Txs3_ManStop( p->pTxs3 );
    // internal use
    Vec_IntFreeP( &p->vPrio   );  // priority flops
    Vec_IntFree( p->vLits     );  // array of literals
    Vec_IntFree( p->vCiObjs   );  // cone leaves
    Vec_IntFree( p->vCoObjs   );  // cone roots
    Vec_IntFree( p->vCiVals   );  // cone leaf values
    Vec_IntFree( p->vCoVals   );  // cone root values
    Vec_IntFree( p->vNodes    );  // cone nodes
    Vec_IntFree( p->vUndo     );  // cone undos
    Vec_IntFree( p->vVisits   );  // intermediate
    Vec_IntFree( p->vCi2Rem   );  // CIs to be removed
    Vec_IntFree( p->vRes      );  // final result
    Vec_PtrFreeP( &p->vInfCubes );
    ABC_FREE( p->pTime4Outs );
    if ( p->vCexes )
        Vec_PtrFreeFree( p->vCexes );
    // additional AIG data-members
    if ( p->pAig->pFanData != NULL )
        Aig_ManFanoutStop( p->pAig );
    if ( p->pAig->pTerSimData != NULL )
        ABC_FREE( p->pAig->pTerSimData );
    ABC_FREE( p );
}